

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

bool cmOutputConverter::Shell_CharNeedsQuotes(char c,int flags)

{
  bool bVar1;
  bool local_9;
  int flags_local;
  char c_local;
  
  if (((flags & 0x100U) == 0) && ((flags & 4U) != 0)) {
    local_9 = false;
  }
  else {
    bVar1 = Shell_CharIsWhitespace(c);
    if (bVar1) {
      local_9 = true;
    }
    else if (((flags & 0x400U) == 0) || (c != '-')) {
      if ((flags & 0x100U) == 0) {
        bVar1 = Shell_CharNeedsQuotesOnWindows(c);
        if (bVar1) {
          return true;
        }
      }
      else {
        bVar1 = Shell_CharNeedsQuotesOnUnix(c);
        if (bVar1) {
          return true;
        }
      }
      local_9 = false;
    }
    else {
      local_9 = true;
    }
  }
  return local_9;
}

Assistant:

bool cmOutputConverter::Shell_CharNeedsQuotes(char c, int flags)
{
  /* On Windows the built-in command shell echo never needs quotes.  */
  if (!(flags & Shell_Flag_IsUnix) && (flags & Shell_Flag_EchoWindows)) {
    return false;
  }

  /* On all platforms quotes are needed to preserve whitespace.  */
  if (Shell_CharIsWhitespace(c)) {
    return true;
  }

  /* Quote hyphens in response files */
  if (flags & Shell_Flag_IsResponse) {
    if (c == '-') {
      return true;
    }
  }

  if (flags & Shell_Flag_IsUnix) {
    /* On UNIX several special characters need quotes to preserve them.  */
    if (Shell_CharNeedsQuotesOnUnix(c)) {
      return true;
    }
  } else {
    /* On Windows several special characters need quotes to preserve them.  */
    if (Shell_CharNeedsQuotesOnWindows(c)) {
      return true;
    }
  }
  return false;
}